

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O2

void __thiscall BatchResultValues::add(BatchResultValues *this,CaseValues *result)

{
  CaseValues *this_00;
  CaseValues *copy;
  
  this_00 = (CaseValues *)operator_new(0x60);
  CaseValues::CaseValues(this_00,result);
  copy = this_00;
  std::vector<CaseValues_*,_std::allocator<CaseValues_*>_>::push_back(&this->m_caseValues,&copy);
  return;
}

Assistant:

void add (const CaseValues& result)
	{
		CaseValues* copy = new CaseValues(result);
		try
		{
			m_caseValues.push_back(copy);
		}
		catch (...)
		{
			delete copy;
			throw;
		}
	}